

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O2

bool __thiscall Controller::readBoardFromFile(Controller *this,string *file)

{
  unsigned_long uVar1;
  BoardSize size;
  BoardMode mode;
  size_t sVar2;
  Board *this_00;
  bool bVar3;
  IOBoard ioBoard;
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> values;
  
  IOBoard::readBoardFromFile(&values,&ioBoard,file);
  if (values.
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_engaged == true) {
    uVar1 = values.
            super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ._M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish[-1];
    sVar2 = Board::getSizeInt((this->board)._M_t.
                              super___uniq_ptr_impl<Board,_std::default_delete<Board>_>._M_t.
                              super__Tuple_impl<0UL,_Board_*,_std::default_delete<Board>_>.
                              super__Head_base<0UL,_Board_*,_false>._M_head_impl);
    if ((uint)uVar1 == sVar2) {
      if (values.
          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
          .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ._M_engaged == false) {
        std::__throw_bad_optional_access();
      }
      values.
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           values.
           super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           ._M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish + -1;
      this_00 = (Board *)operator_new(0x38);
      size = Board::getSize((this->board)._M_t.
                            super___uniq_ptr_impl<Board,_std::default_delete<Board>_>._M_t.
                            super__Tuple_impl<0UL,_Board_*,_std::default_delete<Board>_>.
                            super__Head_base<0UL,_Board_*,_false>._M_head_impl);
      mode = Board::getMode((this->board)._M_t.
                            super___uniq_ptr_impl<Board,_std::default_delete<Board>_>._M_t.
                            super__Tuple_impl<0UL,_Board_*,_std::default_delete<Board>_>.
                            super__Head_base<0UL,_Board_*,_false>._M_head_impl);
      Board::Board(this_00,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&values,size,
                   mode);
      std::__uniq_ptr_impl<Board,_std::default_delete<Board>_>::reset
                ((__uniq_ptr_impl<Board,_std::default_delete<Board>_> *)this,this_00);
      bVar3 = true;
      goto LAB_00109fd4;
    }
    Message::putMessage(FILE_INFO_SIZE_IMPROPER,
                        values.
                        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        ._M_payload._M_value.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish[-1]);
  }
  bVar3 = false;
LAB_00109fd4:
  std::_Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::_M_reset
            ((_Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &values);
  return bVar3;
}

Assistant:

bool Controller::readBoardFromFile( const std::string& file )
{
    IOBoard ioBoard;
    auto values = ioBoard.readBoardFromFile( file );
    if ( values == std::nullopt )
    {
        return false;
    }

    uint savedBoardSize = values->back();
    if ( savedBoardSize != board->getSizeInt() ) {
        Message::putMessage( Result::FILE_INFO_SIZE_IMPROPER, values->back() );
        return false;
    }

    values.value().pop_back();
    board.reset( new Board( std::move( values.value() ), board->getSize(), board->getMode() ));
    return true;
}